

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<float_*>::TPZVec(TPZVec<float_*> *this,int64_t size,float **copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined8 *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  int64_t i;
  long local_20;
  
  *in_RDI = &PTR__TPZVec_023d30c8;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<float *>::TPZVec(const int64_t, const T &) [T = float *]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (in_RSI != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pvVar3 = operator_new__(uVar2);
      in_RDI[1] = pvVar3;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
    for (local_20 = 0; local_20 < (long)in_RSI; local_20 = local_20 + 1) {
      *(undefined8 *)(in_RDI[1] + local_20 * 8) = *in_RDX;
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}